

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dist.c
# Opt level: O0

REF_STATUS
ref_dist_bounding_sphere2
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *center,REF_DBL *radius)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int local_2c;
  REF_INT i;
  REF_DBL *radius_local;
  REF_DBL *center_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_NODE ref_node_local;
  
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    center[local_2c] =
         (ref_node->real[local_2c + node0 * 0xf] + ref_node->real[local_2c + node1 * 0xf]) * 0.5;
  }
  dVar1 = pow(ref_node->real[node0 * 0xf] - *center,2.0);
  dVar2 = pow(ref_node->real[node0 * 0xf + 1] - center[1],2.0);
  dVar3 = pow(ref_node->real[node0 * 0xf + 2] - center[2],2.0);
  dVar1 = sqrt(dVar1 + dVar2 + dVar3);
  *radius = dVar1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_dist_bounding_sphere2(REF_NODE ref_node,
                                                    REF_INT node0,
                                                    REF_INT node1,
                                                    REF_DBL *center,
                                                    REF_DBL *radius) {
  REF_INT i;
  for (i = 0; i < 3; i++)
    center[i] = 0.5 * (ref_node_xyz(ref_node, i, node0) +
                       ref_node_xyz(ref_node, i, node1));
  *radius = sqrt(pow(ref_node_xyz(ref_node, 0, node0) - center[0], 2) +
                 pow(ref_node_xyz(ref_node, 1, node0) - center[1], 2) +
                 pow(ref_node_xyz(ref_node, 2, node0) - center[2], 2));
  return REF_SUCCESS;
}